

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

Stream * rw::ps2::writeNativeData(Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  undefined4 local_58;
  bool32 local_54;
  uint32 buf [2];
  InstanceData *instance;
  uint32 i;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 4)) {
    Stream::writeU32(stream,4);
    lVar1 = *(long *)((long)object + 0x98);
    for (instance._4_4_ = 0; instance._4_4_ < *(uint *)(lVar1 + 4);
        instance._4_4_ = instance._4_4_ + 1) {
      buf = (uint32  [2])(*(long *)(lVar1 + 8) + (ulong)instance._4_4_ * 0x20);
      local_58 = *(undefined4 *)buf;
      local_54 = unfixDmaOffsets((InstanceData *)buf);
      Stream::write32(stream,&local_58,8);
      (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)buf + 0x10),(ulong)*(uint *)buf);
    }
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return stream;
	stream->writeU32(PLATFORM_PS2);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		uint32 buf[2];
		buf[0] = instance->dataSize;
		buf[1] = unfixDmaOffsets(instance);
		stream->write32(buf, 8);
		stream->write8(instance->data, instance->dataSize);
#ifdef RW_PS2
		if(!buf[1])
			fixDmaOffsets(instance);
#endif
	}
	return stream;
}